

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O0

void csp_send_direct(csp_id_t_conflict *idout,csp_packet_t *packet,csp_iface_t *routed_from)

{
  undefined8 uVar1;
  undefined2 uVar2;
  int iVar3;
  uint uVar4;
  csp_iface_t *pcVar5;
  csp_iface_t *in_RDX;
  undefined8 *in_RDI;
  bool bVar6;
  csp_id_t_conflict _idout;
  int local_found;
  csp_packet_t *copy;
  csp_iface_t *iface;
  int via;
  int from_me;
  int in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  uint16_t in_stack_ffffffffffffffbe;
  undefined2 in_stack_ffffffffffffffc0;
  uint16_t in_stack_ffffffffffffffc2;
  undefined2 in_stack_ffffffffffffffc4;
  undefined2 uVar7;
  undefined2 in_stack_ffffffffffffffc6;
  uint16_t uVar8;
  undefined2 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffca;
  undefined2 uVar9;
  int iVar10;
  csp_id_t_conflict *idout_00;
  csp_iface_t *local_28;
  
  bVar6 = in_RDX == (csp_iface_t *)0x0;
  idout_00 = (csp_id_t_conflict *)0x0;
  iVar10 = 0;
  if (*(uint16_t *)((long)in_RDI + 4) == csp_if_lo.addr) {
    csp_send_direct_iface
              ((csp_id_t_conflict *)0x0,
               (csp_packet_t *)(ulong)CONCAT22(in_stack_ffffffffffffffca,in_stack_ffffffffffffffc8),
               (csp_iface_t *)
               CONCAT26(in_stack_ffffffffffffffc6,
                        CONCAT24(in_stack_ffffffffffffffc4,
                                 CONCAT22(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0))),
               in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8);
  }
  else {
    uVar1 = *in_RDI;
    uVar7 = (undefined2)uVar1;
    uVar8 = (uint16_t)((ulong)uVar1 >> 0x10);
    uVar2 = (undefined2)((ulong)uVar1 >> 0x20);
    uVar9 = (undefined2)((ulong)uVar1 >> 0x30);
    while (pcVar5 = csp_iflist_get_by_subnet(in_stack_ffffffffffffffbe,(csp_iface_t *)0x10965d),
          pcVar5 != (csp_iface_t *)0x0) {
      iVar10 = 1;
      if ((pcVar5 != in_RDX) &&
         (iVar3 = csp_iflist_is_within_subnet
                            ((uint16_t)((ulong)idout_00 >> 0x10),
                             (csp_iface_t *)CONCAT44(1,CONCAT22(uVar9,uVar2))), iVar3 == 0)) {
        if ((bVar6) && (*(short *)((long)in_RDI + 2) == 0)) {
          uVar8 = pcVar5->addr;
        }
        iVar3 = csp_id_is_broadcast(in_stack_ffffffffffffffc2,
                                    (csp_iface_t *)
                                    CONCAT26(in_stack_ffffffffffffffbe,
                                             CONCAT24(in_stack_ffffffffffffffbc,
                                                      in_stack_ffffffffffffffb8)));
        if (iVar3 != 0) {
          uVar4 = csp_id_get_max_nodeid();
          uVar2 = (undefined2)uVar4;
        }
        idout_00 = (csp_id_t_conflict *)csp_buffer_clone(in_RDX);
        if (idout_00 != (csp_id_t_conflict *)0x0) {
          csp_send_direct_iface
                    (idout_00,(csp_packet_t *)CONCAT44(iVar10,CONCAT22(uVar9,uVar2)),
                     (csp_iface_t *)
                     CONCAT26(uVar8,CONCAT24(uVar7,CONCAT22(in_stack_ffffffffffffffc2,
                                                            in_stack_ffffffffffffffc0))),
                     in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8);
        }
      }
    }
    if (iVar10 == 1) {
      csp_buffer_free((void *)CONCAT26(uVar8,CONCAT24(uVar7,CONCAT22(in_stack_ffffffffffffffc2,
                                                                     in_stack_ffffffffffffffc0))));
    }
    else {
      local_28 = (csp_iface_t *)0x0;
      while (local_28 = csp_iflist_get_by_isdfl(local_28), local_28 != (csp_iface_t *)0x0) {
        if ((local_28 != in_RDX) &&
           (iVar3 = csp_iflist_is_within_subnet
                              ((uint16_t)((ulong)idout_00 >> 0x10),
                               (csp_iface_t *)CONCAT44(iVar10,CONCAT22(uVar9,uVar2))), iVar3 == 0))
        {
          if ((bVar6) && (*(short *)((long)in_RDI + 2) == 0)) {
            *(uint16_t *)((long)in_RDI + 2) = local_28->addr;
          }
          idout_00 = (csp_id_t_conflict *)csp_buffer_clone(in_RDX);
          if (idout_00 != (csp_id_t_conflict *)0x0) {
            csp_send_direct_iface
                      (idout_00,(csp_packet_t *)CONCAT44(iVar10,CONCAT22(uVar9,uVar2)),
                       (csp_iface_t *)
                       CONCAT26(uVar8,CONCAT24(uVar7,CONCAT22(in_stack_ffffffffffffffc2,
                                                              in_stack_ffffffffffffffc0))),
                       in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8);
          }
        }
      }
      csp_buffer_free((void *)CONCAT26(uVar8,CONCAT24(uVar7,CONCAT22(in_stack_ffffffffffffffc2,
                                                                     in_stack_ffffffffffffffc0))));
    }
  }
  return;
}

Assistant:

void csp_send_direct(csp_id_t* idout, csp_packet_t * packet, csp_iface_t * routed_from) {

	int from_me = (routed_from == NULL ? 1 : 0);

	/* Try to find the destination on any local subnets */
	int via = CSP_NO_VIA_ADDRESS;
	csp_iface_t * iface = NULL;
	csp_packet_t * copy = NULL;
	int local_found = 0;

	/* Quickly send on loopback */
	if(idout->dst == csp_if_lo.addr){
		csp_send_direct_iface(idout, packet, &csp_if_lo, via, from_me);
		return;
	}

	/* Make copy as broadcast modifies destination making iflist_get_by_subnet the skip next redundant ifaces */
	csp_id_t _idout = *idout;

	while ((iface = csp_iflist_get_by_subnet(idout->dst, iface)) != NULL) {

		local_found = 1;

		/* Do not send back to same inteface (split horizon)
		 * This check is is similar to that below, but faster */
		if (iface == routed_from) {
			continue;
		}

		/* Do not send to interface with similar subnet (split horizon) */
		if (csp_iflist_is_within_subnet(iface->addr, routed_from)) {
			continue;
		}

		/* Apply outgoing interface address to packet */
		if ((from_me) && (idout->src == 0)) {
			_idout.src = iface->addr;
		}

		/* Rewrite routed brodcast (L3) to local (L2) when arriving at the interface */
		if (csp_id_is_broadcast(idout->dst, iface)) {
			_idout.dst = csp_id_get_max_nodeid();
		}

		/* Todo: Find an elegant way to avoid making a copy when only a single destination interface
		 * is found. But without looping the list twice. And without using stack memory.
		 * Is this even possible? */
		copy = csp_buffer_clone(packet);
		if (copy != NULL) {
			csp_send_direct_iface(&_idout, copy, iface, via, from_me);
		}

	}

	/* If the above worked, we don't want to look at the routing table */
	if (local_found == 1) {
		csp_buffer_free(packet);
		return;
	}

#if CSP_USE_RTABLE
	/* Try to send via routing table */
	int route_found = 0;
	csp_route_t * route = csp_rtable_find_route(idout->dst);
	if (route != NULL) {
		do {
			route_found = 1;

			/* Do not send back to same inteface (split horizon)
			* This check is is similar to that below, but faster */
			if (route->iface == routed_from) {
				continue;
			}

			/* Do not send to interface with similar subnet (split horizon) */
			if (csp_iflist_is_within_subnet(route->iface->addr, routed_from)) {
				continue;
			}

			/* Apply outgoing interface address to packet */
			if ((from_me) && (idout->src == 0)) {
				idout->src = route->iface->addr;
			}

			copy = csp_buffer_clone(packet);
			if (copy != NULL) {
				csp_send_direct_iface(idout, copy, route->iface, route->via, from_me);
			}
		} while ((route = csp_rtable_search_backward(route)) != NULL);
	}

	/* If the above worked, we don't want to look at default interfaces */
	if (route_found == 1) {
		csp_buffer_free(packet);
		return;
	}

#endif

	/* Try to send via default interfaces */
	while ((iface = csp_iflist_get_by_isdfl(iface)) != NULL) {

		/* Do not send back to same inteface (split horizon)
		 * This check is is similar to that below, but faster */
		if (iface == routed_from) {
			continue;
		}

		/* Do not send to interface with similar subnet (split horizon) */
		if (csp_iflist_is_within_subnet(iface->addr, routed_from)) {
			continue;
		}

		/* Apply outgoing interface address to packet */
		if ((from_me) && (idout->src == 0)) {
			idout->src = iface->addr;
		}

		/* Todo: Find an elegant way to avoid making a copy when only a single destination interface
		 * is found. But without looping the list twice. And without using stack memory.
		 * Is this even possible? */
		copy = csp_buffer_clone(packet);
		if (copy != NULL) {
			csp_send_direct_iface(idout, copy, iface, via, from_me);
		}

	}

	csp_buffer_free(packet);

}